

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O0

float __thiscall nh_ugens::VariableAllpass::process(VariableAllpass *this,float in,float offset)

{
  uint uVar1;
  float fVar2;
  float x;
  float fVar3;
  float out;
  float feedback_plus_input;
  float delayed_signal;
  float y3;
  float y2;
  float y1;
  float y0;
  float position_frac;
  int iposition;
  float position;
  float offset_local;
  float in_local;
  VariableAllpass *this_local;
  
  fVar2 = (float)(this->super_BaseDelay).m_size +
          -((this->super_BaseDelay).m_delay + offset) * (this->super_BaseDelay).m_sample_rate +
          (float)(this->super_BaseDelay).m_read_position;
  uVar1 = (uint)fVar2;
  fVar2 = interpolate_cubic(fVar2 - (float)(int)uVar1,
                            (this->super_BaseDelay).m_buffer
                            [(int)(uVar1 & (this->super_BaseDelay).m_mask)],
                            (this->super_BaseDelay).m_buffer
                            [(int)(uVar1 + 1 & (this->super_BaseDelay).m_mask)],
                            (this->super_BaseDelay).m_buffer
                            [(int)(uVar1 + 2 & (this->super_BaseDelay).m_mask)],
                            (this->super_BaseDelay).m_buffer
                            [(int)(uVar1 + 3 & (this->super_BaseDelay).m_mask)]);
  x = fVar2 * *(float *)&(this->super_BaseDelay).field_0x24 + in;
  fVar3 = flush_denormals(x);
  (this->super_BaseDelay).m_buffer[(this->super_BaseDelay).m_read_position] = fVar3;
  (this->super_BaseDelay).m_read_position =
       (this->super_BaseDelay).m_read_position + 1U & (this->super_BaseDelay).m_mask;
  return x * -*(float *)&(this->super_BaseDelay).field_0x24 + fVar2;
}

Assistant:

float process(float in, float offset) {
        float position = m_read_position - (m_delay + offset) * m_sample_rate;

        // This catches a very sneaky bug -- casting position to int rounds
        // toward zero. To mitigate this, we ensure that the position is always
        // above zero before rounding it down, using the fact that
        // (m_delay + offset) * m_sample_rate < m_size.
        position += m_size;

        int iposition = position;
        float position_frac = position - iposition;

        float y0 = m_buffer[iposition & m_mask];
        float y1 = m_buffer[(iposition + 1) & m_mask];
        float y2 = m_buffer[(iposition + 2) & m_mask];
        float y3 = m_buffer[(iposition + 3) & m_mask];

        float delayed_signal = interpolate_cubic(position_frac, y0, y1, y2, y3);

        float feedback_plus_input = in + delayed_signal * m_k;
        m_buffer[m_read_position] = flush_denormals(feedback_plus_input);
        m_read_position = (m_read_position + 1) & m_mask;
        float out = feedback_plus_input * -m_k + delayed_signal;

        return out;
    }